

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_connect(Curl_easy *data,connectdata **in_connect,_Bool *asyncp,_Bool *protocol_done)

{
  curl_proxytype cVar1;
  uint uVar2;
  char *pcVar3;
  char cVar4;
  unsigned_short uVar5;
  CURLUcode CVar6;
  CURLcode CVar7;
  int iVar8;
  size_t sVar9;
  size_t sVar10;
  connectdata *pcVar11;
  ssl_backend_data *psVar12;
  char *pcVar13;
  CURLU *u;
  char *pcVar14;
  void *pvVar15;
  ulong uVar16;
  size_t sVar17;
  long lVar18;
  connectbundle *bundle;
  connectdata *pcVar19;
  urlpieces *puVar20;
  urlpieces *puVar21;
  Curl_handler **ppCVar22;
  urlpieces *puVar23;
  undefined1 *puVar24;
  Curl_handler *pCVar25;
  Curl_easy *data_00;
  char **ppcVar26;
  _Bool _Var27;
  bool bVar28;
  curltime cVar29;
  _Bool waitpipe;
  _Bool force_reuse;
  connectdata *conn_temp;
  char proxyuser [256];
  _Bool local_2aa;
  _Bool local_2a9;
  connectdata **local_2a8;
  urlpieces *local_2a0;
  char *local_298;
  char *local_290;
  size_t local_288;
  size_t local_280;
  connectdata *local_278;
  char *local_270;
  char *local_268;
  _Bool *local_260;
  _Bool *local_258;
  char *local_250;
  Curl_easy *local_248;
  char *local_240;
  char *local_238 [31];
  undefined1 local_139;
  char local_138 [255];
  undefined1 local_39;
  
  *asyncp = false;
  local_258 = protocol_done;
  (*Curl_cfree)((data->req).protop);
  (data->req).protop = (void *)0x0;
  (*Curl_cfree)((data->req).newurl);
  memset(&data->req,0,0x5a0);
  (data->req).maxdownload = -1;
  local_278 = (connectdata *)0x0;
  local_2a9 = false;
  local_2aa = false;
  sVar9 = Curl_multi_max_host_connections(data->multi);
  sVar10 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  local_260 = asyncp;
  if ((data->change).url == (char *)0x0) {
    CVar7 = CURLE_URL_MALFORMAT;
    goto LAB_0011b542;
  }
  local_288 = sVar9;
  local_280 = sVar10;
  pcVar11 = (connectdata *)(*Curl_ccalloc)(1,0x778);
  if (pcVar11 == (connectdata *)0x0) {
LAB_0011b03c:
    pcVar11 = (connectdata *)0x0;
  }
  else {
    sVar9 = Curl_ssl->sizeof_ssl_backend_data;
    psVar12 = (ssl_backend_data *)(*Curl_ccalloc)(4,sVar9);
    if (psVar12 == (ssl_backend_data *)0x0) {
      (*Curl_cfree)(pcVar11);
      goto LAB_0011b03c;
    }
    pcVar11->ssl_extra = psVar12;
    pcVar11->ssl[0].backend = psVar12;
    pcVar11->ssl[1].backend = (ssl_backend_data *)((psVar12->tap_state).master_key + (sVar9 - 0x1c))
    ;
    pcVar11->proxy_ssl[0].backend =
         (ssl_backend_data *)((psVar12->tap_state).master_key + sVar9 * 2 + -0x1c);
    pcVar11->proxy_ssl[1].backend =
         (ssl_backend_data *)((psVar12->tap_state).master_key + sVar9 * 3 + -0x1c);
    pcVar11->handler = &Curl_handler_dummy;
    pcVar11->connection_id = -1;
    pcVar11->port = -1;
    pcVar11->remote_port = -1;
    pcVar11->sock[0] = -1;
    pcVar11->sock[1] = -1;
    pcVar11->tempsock[0] = -1;
    pcVar11->tempsock[1] = -1;
    Curl_conncontrol(pcVar11,1);
    cVar29 = Curl_now();
    (pcVar11->created).tv_sec = cVar29.tv_sec;
    (pcVar11->created).tv_usec = cVar29.tv_usec;
    cVar29 = Curl_now();
    (pcVar11->keepalive).tv_sec = cVar29.tv_sec;
    (pcVar11->keepalive).tv_usec = cVar29.tv_usec;
    pcVar11->upkeep_interval_ms = (data->set).upkeep_interval_ms;
    pcVar11->data = data;
    cVar1 = (data->set).proxytype;
    (pcVar11->http_proxy).proxytype = cVar1;
    (pcVar11->socks_proxy).proxytype = CURLPROXY_SOCKS4;
    pcVar13 = (data->set).str[0x15];
    if (pcVar13 == (char *)0x0) {
      _Var27 = false;
    }
    else {
      _Var27 = *pcVar13 != '\0';
    }
    (pcVar11->bits).proxy = _Var27;
    (pcVar11->bits).httpproxy = (_Bool)(cVar1 < (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0) & _Var27);
    (pcVar11->bits).socksproxy = (_Bool)(cVar1 >= (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0) & _Var27);
    pcVar13 = (data->set).str[0x16];
    if ((pcVar13 != (char *)0x0) && (*pcVar13 != '\0')) {
      (pcVar11->bits).proxy = true;
      (pcVar11->bits).socksproxy = true;
    }
    (pcVar11->bits).proxy_user_passwd = (data->set).str[0x2f] != (char *)0x0;
    (pcVar11->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
    (pcVar11->bits).user_passwd = (data->set).str[0x2c] != (char *)0x0;
    (pcVar11->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
    (pcVar11->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
    (pcVar11->ssl_config).verifystatus = (data->set).ssl.primary.verifystatus;
    (pcVar11->ssl_config).verifypeer = (data->set).ssl.primary.verifypeer;
    (pcVar11->ssl_config).verifyhost = (data->set).ssl.primary.verifyhost;
    (pcVar11->proxy_ssl_config).verifystatus = (data->set).proxy_ssl.primary.verifystatus;
    (pcVar11->proxy_ssl_config).verifypeer = (data->set).proxy_ssl.primary.verifypeer;
    (pcVar11->proxy_ssl_config).verifyhost = (data->set).proxy_ssl.primary.verifyhost;
    pcVar11->ip_version = (data->set).ipver;
    _Var27 = Curl_pipeline_wanted(data->multi,1);
    if ((_Var27) && (pcVar11->master_buffer == (char *)0x0)) {
      pcVar13 = (char *)(*Curl_ccalloc)(0x4000,1);
      pcVar11->master_buffer = pcVar13;
      if (pcVar13 != (char *)0x0) goto LAB_0011af7a;
LAB_0011aff6:
      Curl_llist_destroy(&pcVar11->send_pipe,(void *)0x0);
      Curl_llist_destroy(&pcVar11->recv_pipe,(void *)0x0);
      (*Curl_cfree)(pcVar11->master_buffer);
      (*Curl_cfree)(pcVar11->localdev);
      (*Curl_cfree)(pcVar11->ssl_extra);
      (*Curl_cfree)(pcVar11);
      goto LAB_0011b03c;
    }
LAB_0011af7a:
    Curl_llist_init(&pcVar11->send_pipe,llist_dtor);
    Curl_llist_init(&pcVar11->recv_pipe,llist_dtor);
    pcVar13 = (data->set).str[8];
    if (pcVar13 != (char *)0x0) {
      pcVar13 = (*Curl_cstrdup)(pcVar13);
      pcVar11->localdev = pcVar13;
      if (pcVar13 == (char *)0x0) goto LAB_0011aff6;
    }
    pcVar11->localportrange = (data->set).localportrange;
    pcVar11->localport = (data->set).localport;
    pcVar11->fclosesocket = (data->set).fclosesocket;
    pcVar11->closesocket_client = (data->set).closesocket_client;
  }
  if (pcVar11 == (connectdata *)0x0) goto LAB_0011b53c;
  *in_connect = pcVar11;
  Curl_up_free(data);
  u = curl_url();
  (data->state).uh = u;
  if (u == (CURLU *)0x0) goto switchD_0011b123_caseD_7;
  if (((data->set).str[7] != (char *)0x0) &&
     (_Var27 = Curl_is_absolute_url((data->change).url,(char *)0x0,8), !_Var27)) {
    if ((data->change).url_alloc == true) {
      (*Curl_cfree)((data->change).url);
    }
    pcVar13 = curl_maprintf("%s://%s",(data->set).str[7],(data->change).url);
    if (pcVar13 == (char *)0x0) goto switchD_0011b123_caseD_7;
    (data->change).url = pcVar13;
    (data->change).url_alloc = true;
  }
  CVar6 = curl_url_set(u,CURLUPART_URL,(data->change).url,
                       (uint)(data->set).path_as_is * 0x10 +
                       (uint)(data->set).disallow_username_in_url * 0x20 + 0x208);
  switch(CVar6) {
  case CURLUE_OK:
    puVar20 = &(data->state).up;
    CVar6 = curl_url_get(u,CURLUPART_SCHEME,&puVar20->scheme,0);
    switch(CVar6) {
    case CURLUE_OK:
      pcVar13 = puVar20->scheme;
      pCVar25 = &Curl_handler_http;
      ppCVar22 = protocols;
      local_2a8 = in_connect;
      local_2a0 = puVar20;
      do {
        ppCVar22 = ppCVar22 + 1;
        iVar8 = Curl_strcasecompare(pCVar25->scheme,pcVar13);
        if (iVar8 != 0) goto LAB_0011b194;
        pCVar25 = *ppCVar22;
      } while (pCVar25 != (Curl_handler *)0x0);
      pCVar25 = (Curl_handler *)0x0;
LAB_0011b194:
      if (((pCVar25 == (Curl_handler *)0x0) ||
          (((uint)(data->set).allowed_protocols & pCVar25->protocol) == 0)) ||
         (((data->state).this_is_a_follow == true &&
          (((uint)(data->set).redir_protocols & pCVar25->protocol) == 0)))) {
        bVar28 = false;
        Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",pcVar13);
        CVar7 = CURLE_UNSUPPORTED_PROTOCOL;
      }
      else {
        pcVar11->given = pCVar25;
        pcVar11->handler = pCVar25;
        CVar7 = CURLE_OK;
        bVar28 = true;
      }
      in_connect = local_2a8;
      if (!bVar28) goto switchD_0011b238_caseD_1;
      break;
    default:
      goto switchD_0011b123_caseD_1;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_0011b123_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_0011b123_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0011b123_caseD_8;
    }
    break;
  default:
switchD_0011b123_caseD_1:
    CVar7 = CURLE_URL_MALFORMAT;
    goto switchD_0011b238_caseD_1;
  case CURLUE_UNSUPPORTED_SCHEME:
switchD_0011b123_caseD_5:
    CVar7 = CURLE_UNSUPPORTED_PROTOCOL;
    goto switchD_0011b238_caseD_1;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_0011b123_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
switchD_0011b123_caseD_8:
    CVar7 = CURLE_LOGIN_DENIED;
    goto switchD_0011b238_caseD_1;
  }
  ppcVar26 = &(data->state).up.user;
  CVar6 = curl_url_get(u,CURLUPART_USER,ppcVar26,0x40);
  CVar7 = CURLE_URL_MALFORMAT;
  switch(CVar6) {
  case CURLUE_OK:
    pcVar13 = (*Curl_cstrdup)(*ppcVar26);
    pcVar11->user = pcVar13;
    if (pcVar13 != (char *)0x0) {
      (pcVar11->bits).user_passwd = true;
      goto switchD_0011b238_caseD_b;
    }
  case CURLUE_OUT_OF_MEMORY:
switchD_0011b123_caseD_7:
    CVar7 = CURLE_OUT_OF_MEMORY;
    break;
  case CURLUE_BAD_HANDLE:
  case CURLUE_BAD_PARTPOINTER:
  case CURLUE_MALFORMED_INPUT:
  case CURLUE_BAD_PORT_NUMBER:
  case CURLUE_URLDECODE:
  case CURLUE_UNKNOWN_PART:
  case CURLUE_NO_SCHEME:
    break;
  case CURLUE_UNSUPPORTED_SCHEME:
    goto switchD_0011b123_caseD_5;
  case CURLUE_USER_NOT_ALLOWED:
    goto switchD_0011b123_caseD_8;
  case CURLUE_NO_USER:
switchD_0011b238_caseD_b:
    ppcVar26 = &(data->state).up.password;
    CVar7 = CURLE_URL_MALFORMAT;
    CVar6 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar26,0x40);
    switch(CVar6) {
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_0011b123_caseD_5;
    case CURLUE_URLDECODE:
    case CURLUE_UNKNOWN_PART:
    case CURLUE_NO_SCHEME:
    case CURLUE_NO_USER:
      break;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_0011b123_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0011b123_caseD_8;
    case CURLUE_NO_PASSWORD:
switchD_0011b297_caseD_c:
      ppcVar26 = &(data->state).up.options;
      CVar6 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar26,0x40);
      switch(CVar6) {
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_0011b123_caseD_5;
      case CURLUE_URLDECODE:
      case CURLUE_UNKNOWN_PART:
      case CURLUE_NO_SCHEME:
      case CURLUE_NO_USER:
      case CURLUE_NO_PASSWORD:
        break;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_0011b123_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_0011b123_caseD_8;
      case CURLUE_NO_OPTIONS:
switchD_0011b30e_caseD_d:
        CVar6 = curl_url_get(u,CURLUPART_HOST,&(data->state).up.hostname,0);
        if ((CVar6 == CURLUE_OK) ||
           (iVar8 = Curl_strcasecompare("file",local_2a0->scheme), iVar8 != 0)) {
          CVar6 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0);
          in_connect = local_2a8;
          switch(CVar6) {
          case CURLUE_OK:
            ppcVar26 = &(data->state).up.port;
            CVar6 = curl_url_get(u,CURLUPART_PORT,ppcVar26,1);
            if (CVar6 == CURLUE_OK) {
              uVar16 = strtoul(*ppcVar26,(char **)0x0,10);
              uVar5 = curlx_ultous(uVar16);
              pcVar11->remote_port = (uint)uVar5;
            }
            else {
              iVar8 = Curl_strcasecompare("file",local_2a0->scheme);
              if (iVar8 == 0) goto LAB_0011b3e4;
            }
            curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
            pcVar13 = (data->state).up.hostname;
            pcVar14 = "";
            if (pcVar13 != (char *)0x0) {
              pcVar14 = pcVar13;
            }
            if (*pcVar14 == '[') {
              pcVar14 = pcVar14 + 1;
              pcVar13 = strchr(pcVar14,0x25);
              (pcVar11->bits).ipv6_ip = true;
              if (pcVar13 != (char *)0x0) {
                lVar18 = 3;
                iVar8 = strncmp("%25",pcVar13,3);
                if (iVar8 != 0) {
                  Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
                  lVar18 = 1;
                }
                uVar16 = strtoul(pcVar13 + lVar18,local_238,10);
                if (*local_238[0] == ']') {
                  sVar17 = strlen(local_238[0]);
                  memmove(pcVar13,local_238[0],sVar17 + 1);
                  pcVar11->scope_id = (uint)uVar16;
                }
                else {
                  Curl_infof(data,"Invalid IPv6 address format\n");
                }
              }
              pcVar13 = strchr(pcVar14,0x5d);
              if (pcVar13 != (char *)0x0) {
                *pcVar13 = '\0';
              }
            }
            pcVar13 = (*Curl_cstrdup)(pcVar14);
            (pcVar11->host).rawalloc = pcVar13;
            CVar7 = CURLE_OUT_OF_MEMORY;
            in_connect = local_2a8;
            if (pcVar13 != (char *)0x0) {
              (pcVar11->host).name = pcVar13;
              uVar2 = (data->set).scope_id;
              CVar7 = CURLE_OK;
              if (uVar2 != 0) {
                pcVar11->scope_id = uVar2;
              }
            }
            break;
          case CURLUE_UNSUPPORTED_SCHEME:
            goto switchD_0011b123_caseD_5;
          case CURLUE_OUT_OF_MEMORY:
            goto switchD_0011b123_caseD_7;
          case CURLUE_USER_NOT_ALLOWED:
            goto switchD_0011b123_caseD_8;
          }
        }
        else {
LAB_0011b3e4:
          CVar7 = CURLE_OUT_OF_MEMORY;
          in_connect = local_2a8;
        }
        break;
      default:
        if (CVar6 == CURLUE_OK) {
          pcVar13 = (*Curl_cstrdup)(*ppcVar26);
          pcVar11->options = pcVar13;
          if (pcVar13 != (char *)0x0) goto switchD_0011b30e_caseD_d;
          goto switchD_0011b123_caseD_7;
        }
      }
      break;
    default:
      if (CVar6 == CURLUE_OK) {
        pcVar13 = (*Curl_cstrdup)(*ppcVar26);
        pcVar11->passwd = pcVar13;
        if (pcVar13 != (char *)0x0) {
          (pcVar11->bits).user_passwd = true;
          goto switchD_0011b297_caseD_c;
        }
        goto switchD_0011b123_caseD_7;
      }
    }
    break;
  default:
    goto switchD_0011b123_caseD_1;
  }
switchD_0011b238_caseD_1:
  if (CVar7 != CURLE_OK) goto LAB_0011b542;
  pcVar13 = (data->set).str[0x39];
  if (pcVar13 != (char *)0x0) {
    pcVar13 = (*Curl_cstrdup)(pcVar13);
    pcVar11->oauth_bearer = pcVar13;
    if (pcVar13 != (char *)0x0) goto LAB_0011b425;
LAB_0011b53c:
    CVar7 = CURLE_OUT_OF_MEMORY;
    goto LAB_0011b542;
  }
LAB_0011b425:
  pcVar13 = (data->set).str[0x3a];
  if (pcVar13 != (char *)0x0) {
    pcVar13 = (*Curl_cstrdup)(pcVar13);
    pcVar11->unix_domain_socket = pcVar13;
    if (pcVar13 == (char *)0x0) goto LAB_0011b53c;
    pcVar11->abstract_unix_socket = (data->set).abstract_unix_socket;
  }
  data_00 = pcVar11->data;
  if ((pcVar11->bits).proxy_user_passwd == true) {
    memset(local_238,0,0x100);
    memset(local_138,0,0x100);
    pcVar13 = (data_00->set).str[0x2f];
    if (pcVar13 != (char *)0x0) {
      strncpy((char *)local_238,pcVar13,0x100);
      local_139 = 0;
    }
    pcVar13 = (data_00->set).str[0x30];
    if (pcVar13 != (char *)0x0) {
      strncpy(local_138,pcVar13,0x100);
      local_39 = 0;
    }
    CVar7 = Curl_urldecode(data_00,(char *)local_238,0,&(pcVar11->http_proxy).user,(size_t *)0x0,
                           false);
    if (CVar7 == CURLE_OK) {
      CVar7 = Curl_urldecode(data_00,local_138,0,&(pcVar11->http_proxy).passwd,(size_t *)0x0,false);
    }
    if (CVar7 == CURLE_OK) goto LAB_0011b5c0;
LAB_0011b535:
    pcVar14 = (char *)0x0;
LAB_0011bb00:
    pcVar13 = (char *)0x0;
  }
  else {
LAB_0011b5c0:
    pcVar13 = (data_00->set).str[0x15];
    if (pcVar13 != (char *)0x0) {
      pcVar13 = (*Curl_cstrdup)(pcVar13);
      if (pcVar13 != (char *)0x0) goto LAB_0011b5ff;
      pcVar14 = (char *)0x0;
      Curl_failf(data_00,"memory shortage");
      CVar7 = CURLE_OUT_OF_MEMORY;
      goto LAB_0011bb00;
    }
    pcVar13 = (char *)0x0;
LAB_0011b5ff:
    pcVar14 = (data_00->set).str[0x16];
    if (pcVar14 == (char *)0x0) {
      pcVar14 = (char *)0x0;
LAB_0011b63d:
      local_2a8 = in_connect;
      local_270 = pcVar14;
      local_268 = pcVar13;
      if ((data_00->set).str[0x31] == (char *)0x0) {
        pcVar14 = "no_proxy";
        pcVar13 = curl_getenv("no_proxy");
        if (pcVar13 == (char *)0x0) {
          pcVar14 = "NO_PROXY";
          pcVar13 = curl_getenv("NO_PROXY");
        }
        if (pcVar13 != (char *)0x0) {
          Curl_infof(pcVar11->data,"Uses proxy env variable %s == \'%s\'\n",pcVar14);
        }
      }
      else {
        pcVar13 = (char *)0x0;
      }
      pcVar14 = (data_00->set).str[0x31];
      if (pcVar14 == (char *)0x0) {
        pcVar14 = pcVar13;
      }
      local_240 = pcVar13;
      if ((pcVar14 == (char *)0x0) || (*pcVar14 == '\0')) {
LAB_0011b85d:
        pcVar14 = local_270;
        pcVar13 = local_268;
        if (local_268 == (char *)0x0 && local_270 == (char *)0x0) {
          pcVar13 = pcVar11->handler->scheme;
          cVar4 = *pcVar13;
          if (cVar4 == '\0') {
            ppcVar26 = local_238;
          }
          else {
            ppcVar26 = local_238;
            do {
              pcVar13 = pcVar13 + 1;
              iVar8 = tolower((int)cVar4);
              *(char *)ppcVar26 = (char)iVar8;
              ppcVar26 = (char **)((long)ppcVar26 + 1);
              cVar4 = *pcVar13;
            } while (cVar4 != '\0');
          }
          *(undefined4 *)((long)ppcVar26 + 3) = 0x79786f;
          *(undefined4 *)ppcVar26 = 0x6f72705f;
          pcVar14 = (char *)local_238;
          pcVar13 = curl_getenv(pcVar14);
          if (pcVar13 == (char *)0x0) {
            iVar8 = Curl_strcasecompare("http_proxy",(char *)local_238);
            if (iVar8 == 0) {
              Curl_strntoupper((char *)local_238,(char *)local_238,0x80);
              pcVar13 = curl_getenv((char *)local_238);
            }
            else {
              pcVar13 = (char *)0x0;
            }
          }
          if (pcVar13 == (char *)0x0) {
            pcVar14 = "all_proxy";
            pcVar13 = curl_getenv("all_proxy");
            if (pcVar13 == (char *)0x0) {
              pcVar14 = "ALL_PROXY";
              pcVar13 = curl_getenv("ALL_PROXY");
            }
          }
          if (pcVar13 != (char *)0x0) {
            Curl_infof(pcVar11->data,"Uses proxy env variable %s == \'%s\'\n",pcVar14);
          }
          pcVar14 = (char *)0x0;
        }
      }
      else {
        local_298 = (pcVar11->host).name;
        iVar8 = Curl_strcasecompare("*",pcVar14);
        if (iVar8 == 0) {
          local_2a0 = (urlpieces *)strlen(pcVar14);
          if (*local_298 == '[') {
            local_290 = strchr(local_298,0x5d);
            if (local_290 == (char *)0x0) goto LAB_0011b85d;
            local_298 = local_298 + 1;
            local_290 = local_290 + -(long)local_298;
          }
          else {
            local_290 = (char *)strlen(local_298);
          }
          if (local_2a0 != (urlpieces *)0x0) {
            local_298 = local_298 + (long)local_290;
            puVar20 = (urlpieces *)0x0;
            local_248 = data_00;
            do {
              puVar23 = (urlpieces *)((long)&puVar20->scheme + 1);
              if (puVar23 < local_2a0) {
                puVar23 = local_2a0;
              }
              do {
                pvVar15 = memchr(", ",(int)pcVar14[(long)puVar20],3);
                data_00 = local_248;
                puVar21 = puVar20;
                if (pvVar15 == (void *)0x0) break;
                puVar20 = (urlpieces *)((long)&puVar20->scheme + 1);
                puVar21 = puVar23;
              } while (puVar23 != puVar20);
              if (puVar21 == local_2a0) break;
              puVar20 = puVar21;
              puVar23 = puVar21;
              if (puVar21 < local_2a0) {
                do {
                  pvVar15 = memchr(", ",(int)pcVar14[(long)puVar23],3);
                  puVar20 = puVar23;
                  if (pvVar15 != (void *)0x0) break;
                  puVar23 = (urlpieces *)((long)&puVar23->scheme + 1);
                  puVar20 = local_2a0;
                } while (local_2a0 != puVar23);
              }
              puVar24 = (undefined1 *)
                        ((long)&puVar21->scheme + (ulong)(pcVar14[(long)puVar21] == '.'));
              pcVar13 = (char *)((long)puVar20 - (long)puVar24);
              if (pcVar13 <= local_290) {
                local_250 = local_298 + -(long)pcVar13;
                iVar8 = Curl_strncasecompare(pcVar14 + (long)puVar24,local_250,(size_t)pcVar13);
                if ((iVar8 != 0) && ((pcVar13 == local_290 || (local_250[-1] == '.'))))
                goto LAB_0011b6e7;
              }
              puVar20 = (urlpieces *)((long)&puVar20->scheme + 1);
            } while (puVar20 < local_2a0);
          }
          goto LAB_0011b85d;
        }
LAB_0011b6e7:
        (*Curl_cfree)(local_268);
        (*Curl_cfree)(local_270);
        pcVar14 = (char *)0x0;
        pcVar13 = (char *)0x0;
      }
      (*Curl_cfree)(local_240);
      if (pcVar13 == (char *)0x0) {
LAB_0011b98c:
        pcVar13 = (char *)0x0;
      }
      else if (pcVar11->unix_domain_socket != (char *)0x0) {
        (*Curl_cfree)(pcVar13);
        goto LAB_0011b98c;
      }
      in_connect = local_2a8;
      if (pcVar13 == (char *)0x0) {
LAB_0011b9bb:
        pcVar13 = (char *)0x0;
      }
      else if ((*pcVar13 == '\0') || ((pcVar11->handler->flags & 0x10) != 0)) {
        (*Curl_cfree)(pcVar13);
        goto LAB_0011b9bb;
      }
      if (pcVar14 == (char *)0x0) {
LAB_0011b9e4:
        pcVar14 = (char *)0x0;
      }
      else if ((*pcVar14 == '\0') || ((pcVar11->handler->flags & 0x10) != 0)) {
        (*Curl_cfree)(pcVar14);
        goto LAB_0011b9e4;
      }
      if (pcVar13 == (char *)0x0 && pcVar14 == (char *)0x0) {
        (pcVar11->bits).socksproxy = false;
        lVar18 = 0x396;
        bVar28 = false;
      }
      else {
        if (pcVar13 != (char *)0x0) {
          CVar7 = parse_proxy(data_00,pcVar11,pcVar13,(pcVar11->http_proxy).proxytype);
          (*Curl_cfree)(pcVar13);
          if (CVar7 != CURLE_OK) goto LAB_0011bb00;
        }
        if (pcVar14 != (char *)0x0) {
          CVar7 = parse_proxy(data_00,pcVar11,pcVar14,(pcVar11->socks_proxy).proxytype);
          (*Curl_cfree)(pcVar14);
          if (CVar7 != CURLE_OK) goto LAB_0011b535;
        }
        pcVar13 = (pcVar11->http_proxy).host.rawalloc;
        if (pcVar13 == (char *)0x0) {
          (pcVar11->bits).httpproxy = false;
          lVar18 = 0x3a1;
          cVar4 = '\0';
        }
        else {
          cVar4 = '\x01';
          lVar18 = 0x396;
          if ((pcVar11->handler->protocol & 3) == 0) {
            if (((pcVar11->handler->flags & 0x800) == 0) || ((pcVar11->bits).tunnel_proxy != false))
            {
              (pcVar11->bits).tunnel_proxy = true;
            }
            else {
              pcVar11->handler = &Curl_handler_http;
            }
          }
        }
        (pcVar11->chunk).hexbuffer[lVar18 + -0x20] = cVar4;
        bVar28 = (pcVar11->socks_proxy).host.rawalloc != (char *)0x0;
        lVar18 = 0x397;
        if ((bVar28 && pcVar13 == (char *)0x0) &&
           (bVar28 = true, (pcVar11->socks_proxy).user == (char *)0x0)) {
          pcVar13 = (pcVar11->socks_proxy).passwd;
          (pcVar11->socks_proxy).user = (pcVar11->http_proxy).user;
          (pcVar11->http_proxy).user = (char *)0x0;
          (*Curl_cfree)(pcVar13);
          (pcVar11->socks_proxy).passwd = (pcVar11->http_proxy).passwd;
          (pcVar11->http_proxy).passwd = (char *)0x0;
        }
      }
      (pcVar11->chunk).hexbuffer[lVar18 + -0x20] = bVar28;
      _Var27 = true;
      if ((pcVar11->bits).httpproxy == false) {
        _Var27 = (pcVar11->bits).socksproxy;
      }
      (pcVar11->bits).proxy = _Var27;
      if (_Var27 == false) {
        (pcVar11->bits).proxy = false;
        (pcVar11->bits).httpproxy = false;
        (pcVar11->bits).socksproxy = false;
        (pcVar11->bits).proxy_user_passwd = false;
        (pcVar11->bits).tunnel_proxy = false;
      }
      pcVar14 = (char *)0x0;
      CVar7 = CURLE_OK;
      goto LAB_0011bb00;
    }
    pcVar14 = (*Curl_cstrdup)(pcVar14);
    if (pcVar14 != (char *)0x0) goto LAB_0011b63d;
    pcVar14 = (char *)0x0;
    Curl_failf(data_00,"memory shortage");
    CVar7 = CURLE_OUT_OF_MEMORY;
  }
  (*Curl_cfree)(pcVar14);
  (*Curl_cfree)(pcVar13);
  if (CVar7 != CURLE_OK) goto LAB_0011b542;
  if (((pcVar11->given->flags & 1) != 0) && ((pcVar11->bits).httpproxy == true)) {
    (pcVar11->bits).tunnel_proxy = true;
  }
  lVar18 = (data->set).use_port;
  if ((lVar18 == 0) || ((data->state).allow_port != true)) {
LAB_0011bba2:
    CVar7 = CURLE_OK;
    bVar28 = true;
  }
  else {
    pcVar11->remote_port = (uint)lVar18 & 0xffff;
    bVar28 = false;
    curl_msnprintf((char *)local_238,0x10,"%u");
    CVar6 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)local_238,0);
    CVar7 = CURLE_OUT_OF_MEMORY;
    if (CVar6 == CURLUE_OK) goto LAB_0011bba2;
  }
  if (((((((!bVar28) ||
          (CVar7 = override_login(data,pcVar11,&pcVar11->user,&pcVar11->passwd,&pcVar11->options),
          CVar7 != CURLE_OK)) || (CVar7 = set_login(pcVar11), CVar7 != CURLE_OK)) ||
        ((CVar7 = parse_connect_to_slist(data,pcVar11,(data->set).connect_to), CVar7 != CURLE_OK ||
         (CVar7 = fix_hostname(pcVar11,&pcVar11->host), CVar7 != CURLE_OK)))) ||
       (((pcVar11->bits).conn_to_host == true &&
        (CVar7 = fix_hostname(pcVar11,&pcVar11->conn_to_host), CVar7 != CURLE_OK)))) ||
      (((pcVar11->bits).httpproxy == true &&
       (CVar7 = fix_hostname(pcVar11,&(pcVar11->http_proxy).host), CVar7 != CURLE_OK)))) ||
     (((pcVar11->bits).socksproxy == true &&
      (CVar7 = fix_hostname(pcVar11,&(pcVar11->socks_proxy).host), CVar7 != CURLE_OK))))
  goto LAB_0011b542;
  if (((pcVar11->bits).conn_to_host == true) &&
     (iVar8 = Curl_strcasecompare((pcVar11->conn_to_host).name,(pcVar11->host).name), iVar8 != 0)) {
    (pcVar11->bits).conn_to_host = false;
  }
  if (((pcVar11->bits).conn_to_port == true) && (pcVar11->conn_to_port == pcVar11->remote_port)) {
    (pcVar11->bits).conn_to_port = false;
  }
  if ((((pcVar11->bits).conn_to_host != false) || ((pcVar11->bits).conn_to_port == true)) &&
     ((pcVar11->bits).httpproxy == true)) {
    (pcVar11->bits).tunnel_proxy = true;
  }
  pcVar11->socktype = 1;
  pCVar25 = pcVar11->handler;
  if (pCVar25->setup_connection == (_func_CURLcode_connectdata_ptr *)0x0) {
LAB_0011bdb6:
    CVar7 = CURLE_OK;
    if (pcVar11->port < 0) {
      pcVar11->port = pCVar25->defport;
    }
  }
  else {
    CVar7 = (*pCVar25->setup_connection)(pcVar11);
    if (CVar7 == CURLE_OK) {
      pCVar25 = pcVar11->handler;
      goto LAB_0011bdb6;
    }
  }
  if (CVar7 != CURLE_OK) goto LAB_0011b542;
  pcVar11->recv[0] = Curl_recv_plain;
  pcVar11->send[0] = Curl_send_plain;
  pcVar11->recv[1] = Curl_recv_plain;
  pcVar11->send[1] = Curl_send_plain;
  (pcVar11->bits).tcp_fastopen = (data->set).tcp_fastopen;
  if ((pcVar11->handler->flags & 0x10) != 0) {
    Curl_persistconninfo(pcVar11);
    CVar7 = (*pcVar11->handler->connect_it)(pcVar11,(_Bool *)local_238);
    if (CVar7 == CURLE_OK) {
      pcVar11->data = data;
      (pcVar11->bits).tcpconnect[0] = true;
      CVar7 = Curl_conncache_add_conn((data->state).conn_cache,pcVar11);
      if (CVar7 != CURLE_OK) goto LAB_0011b542;
      CVar7 = setup_range(data);
      if (CVar7 != CURLE_OK) {
        (*pcVar11->handler->done)(pcVar11,CVar7,false);
        goto LAB_0011b542;
      }
      CVar7 = CURLE_OK;
      Curl_setup_transfer(pcVar11,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
    }
    Curl_init_do(data,pcVar11);
    goto LAB_0011b542;
  }
  pcVar13 = (data->set).str[0x1b];
  (data->set).ssl.primary.CApath = (data->set).str[0x1a];
  (data->set).proxy_ssl.primary.CApath = pcVar13;
  (data->set).ssl.primary.CAfile = (data->set).str[0x1c];
  (data->set).proxy_ssl.primary.CAfile = (data->set).str[0x1d];
  pcVar13 = (data->set).str[0x25];
  (data->set).ssl.primary.random_file = pcVar13;
  (data->set).proxy_ssl.primary.random_file = pcVar13;
  pcVar13 = (data->set).str[0x24];
  (data->set).ssl.primary.egdsocket = pcVar13;
  (data->set).proxy_ssl.primary.egdsocket = pcVar13;
  (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
  (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
  (data->set).ssl.primary.cipher_list13 = (data->set).str[0x22];
  (data->set).proxy_ssl.primary.cipher_list13 = (data->set).str[0x23];
  (data->set).ssl.CRLfile = (data->set).str[0x27];
  (data->set).proxy_ssl.CRLfile = (data->set).str[0x28];
  (data->set).ssl.issuercert = (data->set).str[0x29];
  (data->set).proxy_ssl.issuercert = (data->set).str[0x2a];
  pcVar13 = (data->set).str[0];
  pcVar14 = (data->set).str[1];
  (data->set).ssl.cert = pcVar13;
  (data->set).proxy_ssl.cert = pcVar14;
  (data->set).ssl.cert_type = (data->set).str[2];
  (data->set).proxy_ssl.cert_type = (data->set).str[3];
  pcVar3 = (data->set).str[0xe];
  (data->set).ssl.key = (data->set).str[0xd];
  (data->set).proxy_ssl.key = pcVar3;
  (data->set).ssl.key_type = (data->set).str[0x11];
  (data->set).proxy_ssl.key_type = (data->set).str[0x12];
  (data->set).ssl.key_passwd = (data->set).str[0xf];
  (data->set).proxy_ssl.key_passwd = (data->set).str[0x10];
  (data->set).ssl.primary.clientcert = pcVar13;
  (data->set).proxy_ssl.primary.clientcert = pcVar14;
  _Var27 = Curl_clone_primary_ssl_config(&(data->set).ssl.primary,&pcVar11->ssl_config);
  CVar7 = CURLE_OUT_OF_MEMORY;
  if ((!_Var27) ||
     (_Var27 = Curl_clone_primary_ssl_config
                         (&(data->set).proxy_ssl.primary,&pcVar11->proxy_ssl_config), !_Var27))
  goto LAB_0011b542;
  prune_dead_connections(data);
  if (((data->set).reuse_fresh == true) && ((data->state).this_is_a_follow != true)) {
    _Var27 = false;
  }
  else {
    _Var27 = ConnectionExists(data,pcVar11,&local_278,&local_2a9,&local_2aa);
  }
  pcVar19 = local_278;
  if (((_Var27 != false) && (local_2a9 == false)) &&
     ((iVar8 = IsPipeliningPossible(data,local_278), iVar8 != 0 &&
      ((pcVar19->recv_pipe).size + (pcVar19->send_pipe).size != 0)))) {
    Curl_infof(data,"Found connection %ld, with requests in the pipe (%zu)\n",pcVar19->connection_id
              );
    sVar9 = Curl_conncache_bundle_size(pcVar19);
    if ((sVar9 < local_288) && (sVar9 = Curl_conncache_size(data), sVar9 < local_280)) {
      _Var27 = false;
      Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
      Curl_conncache_return_conn(pcVar19);
    }
  }
  pcVar19 = local_278;
  if (_Var27 == false) {
    if ((pcVar11->handler->flags & 0x100) != 0) {
      if ((data->set).ssl_enable_alpn == true) {
        (pcVar11->bits).tls_enable_alpn = true;
      }
      if ((data->set).ssl_enable_npn == true) {
        (pcVar11->bits).tls_enable_npn = true;
      }
    }
    if (local_2aa == false) {
      bundle = Curl_conncache_find_bundle(pcVar11,(data->state).conn_cache);
      if ((bundle == (connectbundle *)0x0 || local_288 == 0) ||
         (bundle->num_connections < local_288)) {
        Curl_conncache_unlock(pcVar11);
      }
      else {
        pcVar19 = Curl_conncache_extract_bundle(data,bundle);
        Curl_conncache_unlock(pcVar11);
        if (pcVar19 == (connectdata *)0x0) {
          bVar28 = false;
          Curl_infof(data,"No more connections allowed to host: %zu\n",local_288);
          goto LAB_0011c3cc;
        }
        Curl_disconnect(data,pcVar19,false);
      }
      bVar28 = true;
    }
    else {
      bVar28 = false;
    }
LAB_0011c3cc:
    if (((bool)(local_280 != 0 & bVar28)) && (sVar9 = Curl_conncache_size(data), local_280 <= sVar9)
       ) {
      pcVar19 = Curl_conncache_extract_oldest(data);
      if (pcVar19 == (connectdata *)0x0) {
        bVar28 = false;
        Curl_infof(data,"No connections available in cache\n");
      }
      else {
        Curl_disconnect(data,pcVar19,false);
      }
    }
    if (!bVar28) {
      Curl_infof(data,"No connections available.\n");
      conn_free(pcVar11);
      *in_connect = (connectdata *)0x0;
      CVar7 = CURLE_NO_CONNECTION_AVAILABLE;
      goto LAB_0011b542;
    }
    CVar7 = Curl_conncache_add_conn((data->state).conn_cache,pcVar11);
    if (CVar7 != CURLE_OK) goto LAB_0011b542;
    if ((((data->state).authhost.picked & 0x28) != 0) && ((data->state).authhost.done == true)) {
      Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
      (data->state).authhost.picked = 0;
      (data->state).authhost.done = false;
    }
    if ((((data->state).authproxy.picked & 0x28) != 0) && ((data->state).authproxy.done == true)) {
      Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
      (data->state).authproxy.picked = 0;
      (data->state).authproxy.done = false;
    }
  }
  else {
    reuse_conn(pcVar11,local_278);
    (*Curl_cfree)(pcVar11->ssl_extra);
    (*Curl_cfree)(pcVar11);
    *in_connect = pcVar19;
    pcVar13 = "host";
    if ((pcVar19->bits).proxy != false) {
      pcVar13 = "proxy";
    }
    lVar18 = 0x120;
    if (((pcVar19->socks_proxy).host.name == (char *)0x0) &&
       (lVar18 = 0x160, (pcVar19->http_proxy).host.name == (char *)0x0)) {
      lVar18 = 0xd8;
    }
    Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",pcVar19->connection_id,
               pcVar13,*(undefined8 *)((pcVar19->chunk).hexbuffer + lVar18 + -0x20));
    pcVar11 = pcVar19;
  }
  Curl_init_do(data,pcVar11);
  CVar7 = setup_range(data);
  if (CVar7 == CURLE_OK) {
    pcVar11->seek_func = (data->set).seek_func;
    pcVar11->seek_client = (data->set).seek_client;
    CVar7 = resolve_server(data,pcVar11,local_260);
  }
LAB_0011b542:
  if (CVar7 == CURLE_OK) {
    pcVar11 = *in_connect;
    if ((pcVar11->send_pipe).size + (pcVar11->recv_pipe).size == 0) {
      CVar7 = CURLE_OK;
      if (*local_260 == false) {
        CVar7 = Curl_setup_conn(pcVar11,local_258);
      }
    }
    else {
      *local_258 = true;
      CVar7 = CURLE_OK;
    }
  }
  if (CVar7 != CURLE_OK) {
    if (CVar7 != CURLE_NO_CONNECTION_AVAILABLE) {
      if (*in_connect == (connectdata *)0x0) {
        return CVar7;
      }
      Curl_disconnect(data,*in_connect,true);
    }
    *in_connect = (connectdata *)0x0;
  }
  return CVar7;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* init the single-transfer specific data */
  Curl_free_request_state(data);
  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.maxdownload = -1;

  /* call the stuff that needs to be called */
  result = create_conn(data, in_connect, asyncp);

  if(!result) {
    if(CONN_INUSE(*in_connect))
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return result;
  }
  else if(result && *in_connect) {
    /* We're not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_disconnect(data, *in_connect, TRUE);
    *in_connect = NULL; /* return a NULL */
  }

  return result;
}